

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::color3f> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::color3f>
          (optional<tinyusdz::value::color3f> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::value::color3f> local_28;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<tinyusdz::value::color3f>(&local_28,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_28.has_value_;
    if (local_28.has_value_ != true) {
      return __return_storage_ptr__;
    }
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_28.contained._8_4_;
    *(undefined8 *)&__return_storage_ptr__->contained = local_28.contained._0_8_;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  *(undefined8 *)&__return_storage_ptr__->contained = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }